

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  pointer pcVar1;
  ulong uVar2;
  string *psVar3;
  InlinedStringField *pIVar4;
  Nullable<const_char_*> failure_msg;
  string temp;
  uint local_54;
  LogMessageFatal local_50 [2];
  
  psVar3 = (string *)
           Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>(r,lhs,field);
  pIVar4 = Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>(r,rhs,field);
  local_50[0].super_LogMessage.errno_saver_.saved_errno_ =
       ReflectionSchema::InlinedStringIndex(&r->schema_,field);
  local_54 = 0;
  failure_msg = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                          ((uint *)local_50,&local_54,"index > 0u");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    Reflection::MutableInlinedStringDonatedArray(r,lhs);
    Reflection::MutableInlinedStringDonatedArray(r,rhs);
    std::__cxx11::string::string((string *)local_50,psVar3);
    pcVar1 = (pIVar4->field_0).str_._M_dataplus._M_p;
    Reflection::IsInlinedStringDonated(r,lhs,field);
    std::__cxx11::string::assign((char *)psVar3,(ulong)pcVar1);
    uVar2 = CONCAT44(local_50[0].super_LogMessage._4_4_,
                     local_50[0].super_LogMessage.errno_saver_.saved_errno_);
    Reflection::IsInlinedStringDonated(r,rhs,field);
    std::__cxx11::string::assign((char *)pIVar4,uVar2);
    std::__cxx11::string::~string((string *)local_50);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0x2b7,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  uint32_t index = r->schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  uint32_t* lhs_array = r->MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = r->MutableInlinedStringDonatedArray(rhs);
  uint32_t* lhs_state = &lhs_array[index / 32];
  uint32_t* rhs_state = &rhs_array[index / 32];
  bool lhs_arena_dtor_registered = (lhs_array[0] & 0x1u) == 0;
  bool rhs_arena_dtor_registered = (rhs_array[0] & 0x1u) == 0;
  const uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
  if (unsafe_shallow_swap) {
    ABSL_DCHECK_EQ(lhs_arena, rhs_arena);
    InlinedStringField::InternalSwap(lhs_string, lhs_arena_dtor_registered, lhs,
                                     rhs_string, rhs_arena_dtor_registered, rhs,
                                     lhs_arena);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask,
                    lhs);
    rhs_string->Set(temp, rhs_arena, r->IsInlinedStringDonated(*rhs, field),
                    rhs_state, mask, rhs);
  }
}